

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v6::internal::next_code_point<char>(char *begin,char *end)

{
  bool bVar1;
  char *end_local;
  char *begin_local;
  char *local_8;
  
  begin_local = begin;
  if (((int)*begin & 0x80U) == 0) {
    local_8 = begin + 1;
  }
  else {
    do {
      begin_local = begin_local + 1;
      bVar1 = false;
      if (begin_local != end) {
        bVar1 = ((int)*begin_local & 0xc0U) == 0x80;
      }
      local_8 = begin_local;
    } while (bVar1);
  }
  return local_8;
}

Assistant:

FMT_CONSTEXPR const Char* next_code_point(const Char* begin, const Char* end) {
  if (const_check(sizeof(Char) != 1) || (*begin & 0x80) == 0) return begin + 1;
  do {
    ++begin;
  } while (begin != end && (*begin & 0xc0) == 0x80);
  return begin;
}